

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O0

vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> * __thiscall
xmrig::CudaConfig::get
          (CudaConfig *this,Miner *miner,
          vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  undefined1 uVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *this_00;
  vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *__args;
  reference this_01;
  char *pcVar5;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_RCX;
  int __c;
  int __c_00;
  CudaThread **__s;
  Threads<xmrig::CudaThreads> *in_RDI;
  int index;
  CudaThread *thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *__range1;
  CudaThreads *threads;
  anon_class_8_1_e052dfbd deviceIndex;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *out;
  reference in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  CudaDevice *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff68;
  Threads<xmrig::CudaThreads> *this_02;
  CudaThread *local_60;
  __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
  local_58;
  vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *local_50;
  CudaThreads *local_38;
  undefined1 local_29;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *local_20;
  
  local_29 = 0;
  this_02 = in_RDI;
  local_20 = in_RCX;
  std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::vector
            ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)0x226a5e);
  local_38 = Threads<xmrig::CudaThreads>::get(this_02);
  uVar1 = CudaThreads::isEmpty((CudaThreads *)0x226a8d);
  if (!(bool)uVar1) {
    this_00 = (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
              CudaThreads::count((CudaThreads *)0x226ae5);
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::reserve
              ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)this_02,
               CONCAT17(uVar1,in_stack_ffffffffffffff68));
    __args = CudaThreads::data(local_38);
    local_50 = __args;
    local_58._M_current =
         (CudaThread *)
         std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::begin
                   ((vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *)
                    in_stack_ffffffffffffff38);
    local_60 = (CudaThread *)
               std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::end
                         ((vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *)
                          in_stack_ffffffffffffff38);
    while( true ) {
      __s = &local_60;
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (__normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
                ::operator*(&local_58);
      pcVar5 = CudaThread::index(this_01,(char *)__s,__c);
      uVar3 = SUB84(pcVar5,0);
      pcVar5 = (char *)((ulong)pcVar5 & 0xffffffff);
      iVar4 = get::anon_class_8_1_e052dfbd::operator()
                        ((anon_class_8_1_e052dfbd *)in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff44);
      if (iVar4 == -1) {
        in_stack_ffffffffffffff48 = (CudaDevice *)cuda_tag();
        pcVar5 = CudaThread::index(this_01,pcVar5,__c_00);
        in_stack_ffffffffffffff44 = (uint32_t)pcVar5;
        Log::print(INFO,
                   "%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                   in_stack_ffffffffffffff48,(ulong)pcVar5 & 0xffffffff);
      }
      else {
        std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::operator[]
                  (local_20,(long)iVar4);
        std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>::
        emplace_back<xmrig::Miner_const*&,xmrig::CudaThread_const&,xmrig::CudaDevice_const&>
                  (this_00,(Miner **)__args,(CudaThread *)CONCAT44(uVar3,iVar4),
                   in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff38 = this_01;
      }
      __gnu_cxx::
      __normal_iterator<const_xmrig::CudaThread_*,_std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>_>
      ::operator++(&local_58);
    }
  }
  return (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)in_RDI;
}

Assistant:

std::vector<xmrig::CudaLaunchData> xmrig::CudaConfig::get(const Miner *miner, const std::vector<CudaDevice> &devices) const
{
    auto deviceIndex = [&devices](uint32_t index) -> int {
        for (uint32_t i = 0; i < devices.size(); ++i) {
            if (devices[i].index() == index) {
                return i;
            }
        }

        return -1;
    };

    std::vector<CudaLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const auto &thread : threads.data()) {
        const int index = deviceIndex(thread.index());
        if (index == -1) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), cuda_tag(), thread.index());
            continue;
        }

        out.emplace_back(miner, thread, devices[static_cast<size_t>(index)]);
    }

    return out;
}